

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

void ra_init(roaring_array_t *new_ra)

{
  if (new_ra != (roaring_array_t *)0x0) {
    new_ra->keys = (uint16_t *)0x0;
    new_ra->typecodes = (uint8_t *)0x0;
    new_ra->size = 0;
    new_ra->allocation_size = 0;
    new_ra->containers = (void **)0x0;
    new_ra->flags = '\0';
  }
  return;
}

Assistant:

void ra_init(roaring_array_t *new_ra) {
    if (!new_ra) { return; }
    new_ra->keys = NULL;
    new_ra->containers = NULL;
    new_ra->typecodes = NULL;

    new_ra->allocation_size = 0;
    new_ra->size = 0;
    new_ra->flags = 0;
}